

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O3

int sptk::world::anon_unknown_5::ExtendF0
              (double *f0,int f0_length,int origin,int last_point,int shift,double **f0_candidates,
              int number_of_candidates,double allowed_range,double *extended_f0)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  void *pvVar6;
  undefined4 in_register_0000000c;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  double *pdVar17;
  double dVar18;
  int iVar20;
  double dVar19;
  double *pdVar21;
  
  iVar10 = (int)f0;
  uVar7 = (ulong)f0 & 0xffffffff;
  pdVar21 = f0_candidates[iVar10];
  uVar8 = f0_length - iVar10;
  uVar3 = -uVar8;
  if (0 < (int)uVar8) {
    uVar3 = uVar8;
  }
  uVar13 = (ulong)uVar3;
  pvVar6 = operator_new__(uVar13 * 4 + 4);
  auVar5 = _DAT_0012bcc0;
  auVar14._4_4_ = 0;
  auVar14._0_4_ = uVar3;
  auVar14._8_4_ = uVar3;
  auVar14._12_4_ = 0;
  uVar9 = 0;
  auVar14 = auVar14 ^ _DAT_0012bcc0;
  auVar16 = _DAT_0012bcb0;
  do {
    bVar2 = auVar14._0_4_ < SUB164(auVar16 ^ auVar5,0);
    iVar15 = auVar14._4_4_;
    iVar20 = SUB164(auVar16 ^ auVar5,4);
    if ((bool)(~(iVar15 < iVar20 || iVar20 == iVar15 && bVar2) & 1)) {
      *(int *)((long)pvVar6 + uVar9) = iVar10;
    }
    if (iVar15 >= iVar20 && (iVar20 != iVar15 || !bVar2)) {
      *(int *)((long)pvVar6 + uVar9 + 4) = origin + iVar10;
    }
    lVar11 = auVar16._8_8_;
    auVar16._0_8_ = auVar16._0_8_ + 2;
    auVar16._8_8_ = lVar11 + 2;
    uVar9 = uVar9 + 8;
    iVar10 = iVar10 + origin * 2;
  } while ((uVar13 * 4 + 8 & 0x7fffffff8) != uVar9);
  lVar11 = 0;
  iVar10 = 0;
  do {
    uVar9 = (long)*(int *)((long)pvVar6 + lVar11 * 4) + (long)origin;
    pdVar17 = (double *)0x0;
    if (0 < shift) {
      uVar12 = 0;
      dVar18 = allowed_range;
      do {
        dVar1 = *(double *)
                 (*(long *)(CONCAT44(in_register_0000000c,last_point) + uVar9 * 8) + uVar12 * 8);
        dVar19 = ABS((double)pdVar21 - dVar1) / (double)pdVar21;
        dVar4 = dVar18;
        if (dVar19 <= dVar18) {
          dVar4 = dVar19;
        }
        pdVar17 = (double *)
                  (-(ulong)(dVar18 < dVar19) & (ulong)pdVar17 |
                  ~-(ulong)(dVar18 < dVar19) & (ulong)dVar1);
        uVar12 = uVar12 + 1;
        dVar18 = dVar4;
      } while ((uint)shift != uVar12);
    }
    if ((double)pdVar17 != 0.0) {
      uVar7 = uVar9 & 0xffffffff;
    }
    if (NAN((double)pdVar17)) {
      uVar7 = uVar9 & 0xffffffff;
    }
    iVar10 = iVar10 + 1;
    if ((double)pdVar17 != 0.0) {
      iVar10 = 0;
    }
    f0_candidates[uVar9] = pdVar17;
    if (NAN((double)pdVar17)) {
      iVar10 = 0;
    }
    if (iVar10 == 4) break;
    pdVar21 = (double *)
              ((ulong)pdVar21 & -(ulong)((double)pdVar17 == 0.0) |
              ~-(ulong)((double)pdVar17 == 0.0) & (ulong)pdVar17);
    lVar11 = lVar11 + 1;
  } while (lVar11 != uVar13 + 1);
  operator_delete__(pvVar6);
  return (int)uVar7;
}

Assistant:

static int ExtendF0(const double *f0, int f0_length, int origin,
    int last_point, int shift, const double * const *f0_candidates,
    int number_of_candidates, double allowed_range, double *extended_f0) {
  int threshold = 4;
  double tmp_f0 = extended_f0[origin];
  int shifted_origin = origin;

  int distance = MyAbsInt(last_point - origin);
  int *index_list = new int[distance + 1];
  for (int i = 0; i <= distance; ++i) index_list[i] = origin + shift * i;

  int count = 0;
  double dammy;
  for (int i = 0; i <= distance; ++i) {
    extended_f0[index_list[i] + shift] =
      SelectBestF0(tmp_f0, f0_candidates[index_list[i] + shift],
      number_of_candidates, allowed_range, &dammy);
    if (extended_f0[index_list[i] + shift] == 0.0) {
      count++;
    } else {
      tmp_f0 = extended_f0[index_list[i] + shift];
      count = 0;
      shifted_origin = index_list[i] + shift;
    }
    if (count == threshold) break;
  }

  delete[] index_list;
  return shifted_origin;
}